

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  size_t sVar1;
  ptls_iovec_t info;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  undefined1 local_258 [2];
  uint16_t _v;
  int ret;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t hkdf_label;
  char *label_local;
  size_t outlen_local;
  void *output_local;
  ptls_hash_algorithm_t *algo_local;
  ptls_iovec_t secret_local;
  
  if (label_prefix == (char *)0x0) {
    __assert_fail("label_prefix != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0x135e,
                  "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
                 );
  }
  ptls_buffer_init((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),local_258,0x200);
  capacity._2_2_ = (undefined2)outlen;
  capacity._0_1_ = (undefined1)(outlen >> 8);
  capacity._1_1_ = (undefined1)outlen;
  capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),&capacity,2);
  if (capacity._4_4_ == 0) {
    body_start = 1;
    capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),"",1);
    if (capacity._4_4_ == 0) {
      sVar1 = strlen(label_prefix);
      capacity._4_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),label_prefix,sVar1);
      if (capacity._4_4_ == 0) {
        sVar1 = strlen(label);
        capacity._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),label,sVar1);
        if (capacity._4_4_ == 0) {
          for (; body_start != 0; body_start = body_start - 1) {
            *(char *)(hkdf_label_buf._504_8_ + (hkdf_label.capacity - body_start)) =
                 (char)(0L >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
          body_start_1 = 1;
          capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),"",1);
          if (capacity._4_4_ == 0) {
            capacity._4_4_ =
                 ptls_buffer__do_pushv
                           ((ptls_buffer_t *)(hkdf_label_buf + 0x1f8),hash_value.base,hash_value.len
                           );
            if (capacity._4_4_ == 0) {
              for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                *(char *)(hkdf_label_buf._504_8_ + (hkdf_label.capacity - body_start_1)) =
                     (char)(0L >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
              }
              info = ptls_iovec_init((void *)hkdf_label_buf._504_8_,hkdf_label.capacity);
              capacity._4_4_ = ptls_hkdf_expand(algo,output,outlen,secret,info);
            }
          }
        }
      }
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)(hkdf_label_buf + 0x1f8));
  return capacity._4_4_;
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}